

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseAnyValue
          (Parser *this,Value *val,FieldDef *field,size_t parent_fieldn,StructDef *parent_struct_def
          ,size_t count,bool inside_vector)

{
  uint16_t *puVar1;
  int iVar2;
  BaseType BVar3;
  size_type sVar4;
  long lVar5;
  StructDef *struct_def;
  byte bVar6;
  __type _Var7;
  Value *pVVar8;
  long lVar9;
  FieldDef *parent_fieldn_00;
  EnumVal *pEVar10;
  uint8_t *puVar11;
  bool use_string_pooling;
  long lVar12;
  undefined8 *puVar13;
  string *psVar14;
  Vector<unsigned_char,_unsigned_int> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  string constant;
  ParseDepthGuard depth_guard;
  uoffset_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_name;
  string next_name;
  uoffset_t off;
  string local_58 [40];
  
  use_string_pooling = SUB81(field,0);
  switch(*(undefined4 *)&(field->super_Definition).name._M_dataplus._M_p) {
  case 7:
  case 8:
  case 9:
  case 10:
    if (parent_fieldn != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&offset,"hash",(allocator<char> *)&off);
      pVVar8 = SymbolTable<flatbuffers::Value>::Lookup
                         ((SymbolTable<flatbuffers::Value> *)(parent_fieldn + 0x58),
                          (string *)&offset);
      if (pVVar8 == (Value *)0x0) {
        std::__cxx11::string::~string((string *)&offset);
      }
      else {
        iVar2 = *(int *)&(val->type).field_0x1c;
        std::__cxx11::string::~string((string *)&offset);
        if ((iVar2 == 0x104) || (iVar2 == 0x101)) {
          ParseHash(this,val,field);
          break;
        }
      }
    }
  default:
    ParseSingleValue(this,(string *)val,(Value *)parent_fieldn,use_string_pooling);
    break;
  case 0xd:
    ParseString(this,val,use_string_pooling);
    break;
  case 0xe:
  case 0x12:
    ParseVector(this,&val->type,(uoffset_t *)field,(FieldDef *)&off,parent_fieldn);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\x01') goto LAB_0010988b;
    CheckedError::~CheckedError((CheckedError *)this);
    psVar14 = (string *)&offset;
    NumToString<unsigned_int>(psVar14,off);
    std::__cxx11::string::operator=((string *)&(field->super_Definition).file,(string *)psVar14);
LAB_0010975d:
    std::__cxx11::string::~string((string *)psVar14);
    goto LAB_00109887;
  case 0xf:
    ParseTable(this,(StructDef *)val,(string *)(field->super_Definition).name._M_string_length,
               (uoffset_t *)&(field->super_Definition).file);
    break;
  case 0x10:
    if (parent_fieldn == 0) {
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x520,
                    "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                   );
    }
    constant._M_dataplus._M_p = (pointer)&constant.field_2;
    constant._M_string_length = 0;
    constant.field_2._M_local_buf[0] = '\0';
    sVar4 = val[0x19].constant.field_2._M_allocated_capacity;
    lVar9 = CONCAT71(in_stack_00000009,inside_vector) * -0x50 + sVar4;
    puVar13 = (undefined8 *)(CONCAT71(in_stack_00000009,inside_vector) * -0x50 + sVar4 + -0x30);
    for (lVar12 = (long)parent_struct_def * -0x50; lVar12 != 0; lVar12 = lVar12 + 0x50) {
      lVar5 = *(long *)(lVar9 + -8);
      if (*(size_type *)(lVar5 + 0xd8) ==
          (field->super_Definition).name.field_2._M_allocated_capacity) {
        iVar2 = *(int *)(lVar5 + 200);
        if (in_stack_00000010 == '\0') {
          if (iVar2 == 1) {
            std::__cxx11::string::_M_assign((string *)&constant);
            break;
          }
        }
        else if (((iVar2 == 0xe) || (iVar2 == 0x12)) && (*(int *)(lVar5 + 0xcc) == 1)) {
          anon_unknown_0::atot<unsigned_int>
                    ((anon_unknown_0 *)this,(char *)*puVar13,(Parser *)val,&offset);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00109c8d;
          CheckedError::~CheckedError((CheckedError *)this);
          puVar11 = vector_downward<unsigned_int>::data
                              ((vector_downward<unsigned_int> *)&val[6].type.fixed_length);
          this_00 = (Vector<unsigned_char,_unsigned_int> *)
                    (puVar11 + ((ulong)val[7].type.base_type - (ulong)offset));
          goto LAB_001098bc;
        }
      }
      lVar9 = lVar9 + -0x50;
      puVar13 = puVar13 + -10;
    }
    if (constant._M_string_length == 0 && in_stack_00000010 == '\0') {
      std::operator+(&type_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     parent_fieldn,"_type");
      if (count == 0) {
        __assert_fail("parent_struct_def",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x542,
                      "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                     );
      }
      parent_fieldn_00 =
           SymbolTable<flatbuffers::FieldDef>::Lookup
                     ((SymbolTable<flatbuffers::FieldDef> *)(count + 200),&type_name);
      if (parent_fieldn_00 == (FieldDef *)0x0) {
        __assert_fail("type_field",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x544,
                      "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                     );
      }
      ParserState::ParserState((ParserState *)&offset,(ParserState *)val);
      SkipAnyJsonValue(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        ParseComma(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          std::__cxx11::string::string
                    ((string *)&next_name,(string *)&(val->constant)._M_string_length);
          if (*(int *)&(val->type).field_0x1c == 0x101) {
            Next(this);
          }
          else {
            Expect(this,(int)val);
          }
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            _Var7 = std::operator==(&next_name,&type_name);
            if (!_Var7) {
LAB_00109d0b:
              std::__cxx11::string::~string((string *)&next_name);
              ParserState::~ParserState((ParserState *)&offset);
              std::__cxx11::string::~string((string *)&type_name);
              this_00 = (Vector<unsigned_char,_unsigned_int> *)0x0;
              goto LAB_001098bc;
            }
            Expect(this,(int)val);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              ParseDepthGuard::ParseDepthGuard(&depth_guard,(Parser *)val);
              ParseDepthGuard::Check((ParseDepthGuard *)this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckedError::~CheckedError((CheckedError *)this);
                Value::Value((Value *)&off,&parent_fieldn_00->value);
                ParseAnyValue(this,val,(FieldDef *)&off,(size_t)parent_fieldn_00,(StructDef *)0x0,0,
                              false);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckedError::~CheckedError((CheckedError *)this);
                  std::__cxx11::string::_M_assign((string *)&constant);
                  ParserState::operator=((ParserState *)val,(ParserState *)&offset);
                  std::__cxx11::string::~string(local_58);
                  (depth_guard.parser_)->parse_depth_counter_ =
                       (depth_guard.parser_)->parse_depth_counter_ + -1;
                  goto LAB_00109d0b;
                }
                std::__cxx11::string::~string(local_58);
              }
              (depth_guard.parser_)->parse_depth_counter_ =
                   (depth_guard.parser_)->parse_depth_counter_ + -1;
            }
          }
          std::__cxx11::string::~string((string *)&next_name);
        }
      }
      ParserState::~ParserState((ParserState *)&offset);
      this_01 = &type_name;
LAB_00109c88:
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      this_00 = (Vector<unsigned_char,_unsigned_int> *)0x0;
LAB_001098bc:
      if ((constant._M_string_length == 0) &&
         (this_00 == (Vector<unsigned_char,_unsigned_int> *)0x0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                       "missing type field for this union value: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       parent_fieldn);
        Error(this,(string *)val);
        goto LAB_00109c83;
      }
      if (this_00 == (Vector<unsigned_char,_unsigned_int> *)0x0) {
        anon_unknown_0::atot<unsigned_char>
                  ((anon_unknown_0 *)this,constant._M_dataplus._M_p,(Parser *)val,(uchar *)&off);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          bVar6 = (byte)off;
          goto LAB_00109a10;
        }
        goto LAB_00109c8d;
      }
      if ((ulong)*(uint *)this_00 <= CONCAT71(in_stack_00000009,inside_vector)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                       "union types vector smaller than union values vector for: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       parent_fieldn);
        Error(this,(string *)val);
LAB_00109c83:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset;
        goto LAB_00109c88;
      }
      bVar6 = Vector<unsigned_char,_unsigned_int>::Get
                        (this_00,(uint)CONCAT71(in_stack_00000009,inside_vector));
      off = CONCAT31(off._1_3_,bVar6);
LAB_00109a10:
      pEVar10 = EnumDef::ReverseLookup
                          ((EnumDef *)(field->super_Definition).name.field_2._M_allocated_capacity,
                           (ulong)bVar6,true);
      if (pEVar10 == (EnumVal *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                       "illegal type id for: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       parent_fieldn);
        Error(this,(string *)val);
        goto LAB_00109c83;
      }
      BVar3 = (pEVar10->union_type).base_type;
      if (BVar3 == BASE_TYPE_STRING) {
        ParseString(this,val,use_string_pooling);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          goto LAB_00109cc4;
        }
      }
      else {
        if (BVar3 != BASE_TYPE_STRUCT) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                        ,0x575,
                        "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                       );
        }
        psVar14 = &(field->super_Definition).file;
        ParseTable(this,(StructDef *)val,(string *)(pEVar10->union_type).struct_def,
                   (uoffset_t *)psVar14);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          struct_def = (pEVar10->union_type).struct_def;
          if (struct_def->fixed == true) {
            SerializeStruct((Parser *)val,struct_def,(Value *)field);
            puVar1 = &val[7].type.fixed_length;
            *(ulong *)puVar1 =
                 *(long *)puVar1 + (ulong)*(uint *)&val[7].constant._M_dataplus._M_p * -8;
            *(undefined4 *)&val[7].constant._M_dataplus._M_p = 0;
            *(undefined2 *)((long)&val[7].constant._M_dataplus._M_p + 4) = 0;
            NumToString<unsigned_int>((string *)&offset,val[7].type.base_type);
            std::__cxx11::string::operator=((string *)psVar14,(string *)&offset);
            std::__cxx11::string::~string((string *)&offset);
          }
LAB_00109cc4:
          psVar14 = &constant;
          goto LAB_0010975d;
        }
      }
    }
LAB_00109c8d:
    std::__cxx11::string::~string((string *)&constant);
    goto LAB_0010988b;
  case 0x11:
    ParseArray(this,val);
  }
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
LAB_00109887:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0010988b:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseAnyValue(Value &val, FieldDef *field,
                                   size_t parent_fieldn,
                                   const StructDef *parent_struct_def,
                                   size_t count, bool inside_vector) {
  switch (val.type.base_type) {
    case BASE_TYPE_UNION: {
      FLATBUFFERS_ASSERT(field);
      std::string constant;
      Vector<uint8_t> *vector_of_union_types = nullptr;
      // Find corresponding type field we may have already parsed.
      for (auto elem = field_stack_.rbegin() + count;
           elem != field_stack_.rbegin() + parent_fieldn + count; ++elem) {
        auto &type = elem->second->value.type;
        if (type.enum_def == val.type.enum_def) {
          if (inside_vector) {
            if (IsVector(type) && type.element == BASE_TYPE_UTYPE) {
              // Vector of union type field.
              uoffset_t offset;
              ECHECK(atot(elem->first.constant.c_str(), *this, &offset));
              vector_of_union_types = reinterpret_cast<Vector<uint8_t> *>(
                  builder_.GetCurrentBufferPointer() + builder_.GetSize() -
                  offset);
              break;
            }
          } else {
            if (type.base_type == BASE_TYPE_UTYPE) {
              // Union type field.
              constant = elem->first.constant;
              break;
            }
          }
        }
      }
      if (constant.empty() && !inside_vector) {
        // We haven't seen the type field yet. Sadly a lot of JSON writers
        // output these in alphabetical order, meaning it comes after this
        // value. So we scan past the value to find it, then come back here.
        // We currently don't do this for vectors of unions because the
        // scanning/serialization logic would get very complicated.
        auto type_name = field->name + UnionTypeFieldSuffix();
        FLATBUFFERS_ASSERT(parent_struct_def);
        auto type_field = parent_struct_def->fields.Lookup(type_name);
        FLATBUFFERS_ASSERT(type_field);  // Guaranteed by ParseField().
        // Remember where we are in the source file, so we can come back here.
        auto backup = *static_cast<ParserState *>(this);
        ECHECK(SkipAnyJsonValue());  // The table.
        ECHECK(ParseComma());
        auto next_name = attribute_;
        if (Is(kTokenStringConstant)) {
          NEXT();
        } else {
          EXPECT(kTokenIdentifier);
        }
        if (next_name == type_name) {
          EXPECT(':');
          ParseDepthGuard depth_guard(this);
          ECHECK(depth_guard.Check());
          Value type_val = type_field->value;
          ECHECK(ParseAnyValue(type_val, type_field, 0, nullptr, 0));
          constant = type_val.constant;
          // Got the information we needed, now rewind:
          *static_cast<ParserState *>(this) = backup;
        }
      }
      if (constant.empty() && !vector_of_union_types) {
        return Error("missing type field for this union value: " + field->name);
      }
      uint8_t enum_idx;
      if (vector_of_union_types) {
        if (vector_of_union_types->size() <= count)
          return Error(
              "union types vector smaller than union values vector for: " +
              field->name);
        enum_idx = vector_of_union_types->Get(static_cast<uoffset_t>(count));
      } else {
        ECHECK(atot(constant.c_str(), *this, &enum_idx));
      }
      auto enum_val = val.type.enum_def->ReverseLookup(enum_idx, true);
      if (!enum_val) return Error("illegal type id for: " + field->name);
      if (enum_val->union_type.base_type == BASE_TYPE_STRUCT) {
        ECHECK(ParseTable(*enum_val->union_type.struct_def, &val.constant,
                          nullptr));
        if (enum_val->union_type.struct_def->fixed) {
          // All BASE_TYPE_UNION values are offsets, so turn this into one.
          SerializeStruct(*enum_val->union_type.struct_def, val);
          builder_.ClearOffsets();
          val.constant = NumToString(builder_.GetSize());
        }
      } else if (IsString(enum_val->union_type)) {
        ECHECK(ParseString(val, field->shared));
      } else {
        FLATBUFFERS_ASSERT(false);
      }
      break;
    }
    case BASE_TYPE_STRUCT:
      ECHECK(ParseTable(*val.type.struct_def, &val.constant, nullptr));
      break;
    case BASE_TYPE_STRING: {
      ECHECK(ParseString(val, field->shared));
      break;
    }
    case BASE_TYPE_VECTOR64:
    case BASE_TYPE_VECTOR: {
      uoffset_t off;
      ECHECK(ParseVector(val.type, &off, field, parent_fieldn));
      val.constant = NumToString(off);
      break;
    }
    case BASE_TYPE_ARRAY: {
      ECHECK(ParseArray(val));
      break;
    }
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG: {
      if (field && field->attributes.Lookup("hash") &&
          (token_ == kTokenIdentifier || token_ == kTokenStringConstant)) {
        ECHECK(ParseHash(val, field));
      } else {
        ECHECK(ParseSingleValue(field ? &field->name : nullptr, val, false));
      }
      break;
    }
    default:
      ECHECK(ParseSingleValue(field ? &field->name : nullptr, val, false));
      break;
  }
  return NoError();
}